

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_scandir_non_existent_dir(void)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  uint uVar3;
  int iVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar5;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 *__s1;
  __off64_t _Var9;
  void *pvVar10;
  void *pvVar11;
  char *pcVar12;
  uv_fs_t *puVar13;
  char *pcVar14;
  undefined1 *puVar15;
  long unaff_R12;
  uv_fs_t *__s;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uv_buf_t uVar21;
  uv_dirent_t dent;
  uv_fs_t req;
  undefined1 auStack_872 [2];
  code *pcStack_870;
  undefined8 uStack_868;
  long lStack_858;
  void *pvStack_850;
  long lStack_848;
  undefined1 auStack_7d8 [16];
  undefined1 auStack_7c8 [16];
  undefined8 uStack_7b0;
  uv_fs_t *puStack_7a8;
  uv_fs_t *puStack_7a0;
  undefined8 uStack_798;
  code *pcStack_788;
  code *pcStack_780;
  undefined8 uStack_778;
  undefined1 auStack_768 [16];
  undefined1 auStack_758 [16];
  undefined1 auStack_748 [16];
  undefined1 auStack_738 [16];
  undefined1 auStack_728 [256];
  undefined1 auStack_628 [256];
  undefined1 auStack_528 [128];
  undefined1 auStack_4a8 [136];
  undefined1 *puStack_420;
  uv_fs_t *puStack_418;
  code *pcStack_410;
  undefined8 uStack_408;
  code *pcStack_3f8;
  undefined8 uStack_3f0;
  code *pcStack_3e0;
  uv_fs_t *puStack_3d8;
  code *pcStack_3d0;
  uv_fs_t uStack_3c8;
  uv_fs_t *puStack_210;
  uv_fs_t *puStack_208;
  code *pcStack_200;
  uv_fs_t *puStack_1f8;
  undefined1 auStack_1e8 [8];
  code *pcStack_1e0;
  undefined1 auStack_1d8 [16];
  void *local_170;
  void *local_168;
  
  pcStack_1e0 = (code *)0x1570db;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = "./non_existent_dir/";
  __s = (uv_fs_t *)&stack0xfffffffffffffe38;
  pcStack_1e0 = (code *)0x1570fd;
  uv_fs_rmdir(0,__s,"./non_existent_dir/",0);
  pcStack_1e0 = (code *)0x157105;
  uv_fs_req_cleanup(__s);
  pcStack_1e0 = (code *)0x157117;
  memset(__s,0xdb,0x1b8);
  puVar5 = (uv_loop_t *)0x0;
  pcStack_1e0 = (code *)0x157129;
  iVar2 = uv_fs_scandir(0,__s,"./non_existent_dir/",0,0);
  if (iVar2 == -2) {
    if (local_170 != (void *)0xfffffffffffffffe) goto LAB_001571f7;
    if (local_168 != (void *)0x0) goto LAB_001571fc;
    puVar5 = (uv_loop_t *)&stack0xfffffffffffffe38;
    pcStack_1e0 = (code *)0x157157;
    iVar2 = uv_fs_scandir_next(puVar5,auStack_1d8);
    if (iVar2 != -2) goto LAB_00157201;
    pcStack_1e0 = (code *)0x15716a;
    uv_fs_req_cleanup(&stack0xfffffffffffffe38);
    pcStack_1e0 = (code *)0x15718d;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    if (iVar2 != 0) goto LAB_00157206;
    if (scandir_cb_count != 0) goto LAB_0015720b;
    pcStack_1e0 = (code *)0x1571a8;
    puVar5 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_00157210;
    pcStack_1e0 = (code *)0x1571b6;
    pcVar12 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x1571ca;
    uv_walk(pcVar12,close_walk_cb,0);
    pcStack_1e0 = (code *)0x1571d4;
    uv_run(pcVar12,0);
    pcStack_1e0 = (code *)0x1571d9;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_1e0 = (code *)0x1571e1;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1571f7;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_001571f7:
    pcStack_1e0 = (code *)0x1571fc;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_001571fc:
    pcStack_1e0 = (code *)0x157201;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_00157201:
    pcStack_1e0 = (code *)0x157206;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_00157206:
    pcStack_1e0 = (code *)0x15720b;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_0015720b:
    pcStack_1e0 = (code *)0x157210;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_00157210:
    pcStack_1e0 = (code *)0x157215;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  pcStack_1e0 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00157279;
    if (scandir_req.result != -2) goto LAB_0015727e;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00157283;
    puStack_1f8 = (uv_fs_t *)0x157258;
    iVar2 = uv_fs_scandir_next(&scandir_req,auStack_1e8);
    if (iVar2 == -2) {
      puStack_1f8 = (uv_fs_t *)0x157269;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    puStack_1f8 = (uv_fs_t *)0x157279;
    non_existent_scandir_cb_cold_1();
LAB_00157279:
    puStack_1f8 = (uv_fs_t *)0x15727e;
    non_existent_scandir_cb_cold_2();
LAB_0015727e:
    puStack_1f8 = (uv_fs_t *)0x157283;
    non_existent_scandir_cb_cold_3();
LAB_00157283:
    puStack_1f8 = (uv_fs_t *)0x157288;
    non_existent_scandir_cb_cold_4();
  }
  puStack_1f8 = (uv_fs_t *)run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  pcStack_200 = (code *)0x157293;
  puStack_1f8 = (uv_fs_t *)pcVar12;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_200 = (code *)0x1572b4;
  iVar2 = uv_fs_scandir(0,&scandir_req,"test/fixtures/empty_file",0,0);
  if (iVar2 == -0x14) {
    puVar13 = &scandir_req;
    pcStack_200 = (code *)0x1572cc;
    uv_fs_req_cleanup(&scandir_req);
    pcStack_200 = (code *)0x1572eb;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar2 != 0) goto LAB_0015734c;
    if (scandir_cb_count != 0) goto LAB_00157351;
    pcStack_200 = (code *)0x157306;
    puVar5 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_00157356;
    pcStack_200 = (code *)0x157314;
    puVar13 = (uv_fs_t *)uv_default_loop();
    pcStack_200 = (code *)0x157328;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_200 = (code *)0x157332;
    uv_run(puVar13,0);
    pcStack_200 = (code *)0x157337;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_200 = (code *)0x15733f;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_200 = (code *)0x15734c;
    run_test_fs_scandir_file_cold_1();
    puVar13 = (uv_fs_t *)pcVar12;
LAB_0015734c:
    pcStack_200 = (code *)0x157351;
    run_test_fs_scandir_file_cold_2();
LAB_00157351:
    pcStack_200 = (code *)0x157356;
    run_test_fs_scandir_file_cold_3();
LAB_00157356:
    pcStack_200 = (code *)0x15735b;
    run_test_fs_scandir_file_cold_4();
  }
  pcStack_200 = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_001573a3;
    if (scandir_req.result != -0x14) goto LAB_001573a8;
    if (scandir_req.ptr == (void *)0x0) {
      puStack_208 = (uv_fs_t *)0x157396;
      pcStack_200._0_4_ = extraout_EAX;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return (int)pcStack_200;
    }
  }
  else {
    puStack_208 = (uv_fs_t *)0x1573a3;
    file_scandir_cb_cold_1();
LAB_001573a3:
    puStack_208 = (uv_fs_t *)0x1573a8;
    file_scandir_cb_cold_2();
LAB_001573a8:
    puStack_208 = (uv_fs_t *)0x1573ad;
    file_scandir_cb_cold_3();
  }
  puStack_208 = (uv_fs_t *)run_test_fs_open_dir;
  file_scandir_cb_cold_4();
  pcStack_3d0 = (code *)0x1573c1;
  puStack_210 = puVar13;
  puStack_208 = __s;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_3d0 = (code *)0x1573e1;
  uVar3 = uv_fs_open(0,&uStack_3c8,".",0,0,0);
  if ((int)uVar3 < 0) {
    pcStack_3d0 = (code *)0x1574b0;
    run_test_fs_open_dir_cold_1();
LAB_001574b0:
    pcStack_3d0 = (code *)0x1574b5;
    run_test_fs_open_dir_cold_2();
LAB_001574b5:
    pcStack_3d0 = (code *)0x1574ba;
    run_test_fs_open_dir_cold_3();
LAB_001574ba:
    pcStack_3d0 = (code *)0x1574bf;
    run_test_fs_open_dir_cold_4();
LAB_001574bf:
    pcStack_3d0 = (code *)0x1574c4;
    run_test_fs_open_dir_cold_5();
LAB_001574c4:
    pcStack_3d0 = (code *)0x1574c9;
    run_test_fs_open_dir_cold_6();
LAB_001574c9:
    pcStack_3d0 = (code *)0x1574ce;
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_3c8.result < 0) goto LAB_001574b0;
    if (uStack_3c8.ptr != (void *)0x0) goto LAB_001574b5;
    puVar13 = (uv_fs_t *)(ulong)uVar3;
    pcStack_3d0 = (code *)0x15740e;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_3d0 = (code *)0x15741c;
    iVar2 = uv_fs_close(0,&uStack_3c8,puVar13,0);
    __s = &uStack_3c8;
    if (iVar2 != 0) goto LAB_001574ba;
    pcStack_3d0 = (code *)0x157446;
    puVar5 = loop;
    iVar2 = uv_fs_open(loop,&uStack_3c8,".",0,0,open_cb_simple);
    __s = &uStack_3c8;
    if (iVar2 != 0) goto LAB_001574bf;
    __s = &uStack_3c8;
    if (open_cb_count != 0) goto LAB_001574c4;
    pcStack_3d0 = (code *)0x157461;
    puVar5 = loop;
    uv_run(loop,0);
    __s = &uStack_3c8;
    if (open_cb_count != 1) goto LAB_001574c9;
    pcStack_3d0 = (code *)0x15746f;
    puVar13 = (uv_fs_t *)uv_default_loop();
    pcStack_3d0 = (code *)0x157483;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_3d0 = (code *)0x15748d;
    uv_run(puVar13,0);
    pcStack_3d0 = (code *)0x157492;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_3d0 = (code *)0x15749a;
    iVar2 = uv_loop_close();
    __s = &uStack_3c8;
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_3d0 = open_cb_simple;
  run_test_fs_open_dir_cold_8();
  if (puVar5->backend_fd == 1) {
    puVar6 = (uv_loop_t *)puVar5->watcher_queue[0];
    if ((long)puVar6 < 0) goto LAB_001574fb;
    open_cb_count = open_cb_count + 1;
    puVar6 = puVar5;
    if (puVar5->watchers != (uv__io_t **)0x0) {
      iVar2 = uv_fs_req_cleanup();
      return iVar2;
    }
  }
  else {
    puStack_3d8 = (uv_fs_t *)0x1574fb;
    open_cb_simple_cold_1();
    puVar6 = extraout_RAX;
LAB_001574fb:
    puStack_3d8 = (uv_fs_t *)0x157503;
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar6;
  puStack_3d8 = (uv_fs_t *)run_test_fs_file_open_append;
  open_cb_simple_cold_2();
  pcStack_3e0 = (code *)0x15750e;
  puStack_3d8 = puVar13;
  fs_file_open_append(iVar2);
  pcStack_3e0 = (code *)0x157513;
  fs_file_open_append(iVar2);
  pcStack_3e0 = (code *)0x157518;
  uVar7 = uv_default_loop();
  pcStack_3e0 = (code *)0x15752c;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_3e0 = (code *)0x157536;
  uv_run(uVar7,0);
  pcStack_3e0 = (code *)0x15753b;
  uVar8 = uv_default_loop();
  pcStack_3e0 = (code *)0x157543;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_3e0 = fs_file_open_append;
  run_test_fs_file_open_append_cold_1();
  pcVar12 = "test_file";
  pcStack_3f8 = (code *)0x157564;
  pcStack_3e0 = (code *)uVar7;
  unlink("test_file");
  pcStack_3f8 = (code *)0x157569;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_3f8 = (code *)0x15758f;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    pcStack_3f8 = (code *)0x157884;
    fs_file_open_append_cold_1();
LAB_00157884:
    pcStack_3f8 = (code *)0x157889;
    fs_file_open_append_cold_2();
LAB_00157889:
    pcStack_3f8 = (code *)0x15788e;
    fs_file_open_append_cold_3();
LAB_0015788e:
    pcStack_3f8 = (code *)0x157893;
    fs_file_open_append_cold_4();
LAB_00157893:
    pcStack_3f8 = (code *)0x157898;
    fs_file_open_append_cold_5();
LAB_00157898:
    pcStack_3f8 = (code *)0x15789d;
    fs_file_open_append_cold_6();
LAB_0015789d:
    pcStack_3f8 = (code *)0x1578a2;
    fs_file_open_append_cold_7();
LAB_001578a2:
    pcStack_3f8 = (code *)0x1578a7;
    fs_file_open_append_cold_8();
LAB_001578a7:
    pcStack_3f8 = (code *)0x1578ac;
    fs_file_open_append_cold_9();
LAB_001578ac:
    pcStack_3f8 = (code *)0x1578b1;
    fs_file_open_append_cold_10();
LAB_001578b1:
    pcStack_3f8 = (code *)0x1578b6;
    fs_file_open_append_cold_11();
LAB_001578b6:
    pcStack_3f8 = (code *)0x1578bb;
    fs_file_open_append_cold_12();
LAB_001578bb:
    pcStack_3f8 = (code *)0x1578c0;
    fs_file_open_append_cold_13();
LAB_001578c0:
    pcStack_3f8 = (code *)0x1578c5;
    fs_file_open_append_cold_14();
LAB_001578c5:
    pcStack_3f8 = (code *)0x1578ca;
    fs_file_open_append_cold_15();
LAB_001578ca:
    pcStack_3f8 = (code *)0x1578cf;
    fs_file_open_append_cold_16();
LAB_001578cf:
    pcStack_3f8 = (code *)0x1578d4;
    fs_file_open_append_cold_17();
LAB_001578d4:
    pcStack_3f8 = (code *)0x1578d9;
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157884;
    pcStack_3f8 = (code *)0x1575b1;
    uv_fs_req_cleanup(&open_req1);
    pcStack_3f8 = (code *)0x1575c2;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3f0 = 0;
    pcStack_3f8 = (code *)0x157600;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157889;
    if (write_req.result < 0) goto LAB_0015788e;
    pcStack_3f8 = (code *)0x157622;
    uv_fs_req_cleanup(&write_req);
    pcStack_3f8 = (code *)0x157638;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157893;
    if (close_req.result != 0) goto LAB_00157898;
    pcStack_3f8 = (code *)0x15765a;
    uv_fs_req_cleanup(&close_req);
    pcStack_3f8 = (code *)0x15767a;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar2 < 0) goto LAB_0015789d;
    if (open_req1.result._4_4_ < 0) goto LAB_001578a2;
    pcStack_3f8 = (code *)0x15769c;
    uv_fs_req_cleanup(&open_req1);
    pcStack_3f8 = (code *)0x1576ad;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3f0 = 0;
    pcStack_3f8 = (code *)0x1576eb;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_001578a7;
    if (write_req.result < 0) goto LAB_001578ac;
    pcStack_3f8 = (code *)0x15770d;
    uv_fs_req_cleanup(&write_req);
    pcStack_3f8 = (code *)0x157723;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001578b1;
    if (close_req.result != 0) goto LAB_001578b6;
    pcStack_3f8 = (code *)0x157745;
    uv_fs_req_cleanup(&close_req);
    pcStack_3f8 = (code *)0x157765;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar2 < 0) goto LAB_001578bb;
    if (open_req1.result._4_4_ < 0) goto LAB_001578c0;
    pcStack_3f8 = (code *)0x157787;
    uv_fs_req_cleanup(&open_req1);
    pcStack_3f8 = (code *)0x157798;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3f0 = 0;
    pcStack_3f8 = (code *)0x1577d6;
    iov = uVar21;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    pcVar12 = (char *)(ulong)uVar3;
    pcStack_3f8 = (code *)0x1577e8;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_001578c5;
    if (read_req.result != 0x1a) goto LAB_001578ca;
    auVar20[0] = -(buf[10] == 'r');
    auVar20[1] = -(buf[0xb] == '\n');
    auVar20[2] = -(buf[0xc] == '\0');
    auVar20[3] = -(buf[0xd] == 't');
    auVar20[4] = -(buf[0xe] == 'e');
    auVar20[5] = -(buf[0xf] == 's');
    auVar20[6] = -(buf[0x10] == 't');
    auVar20[7] = -(buf[0x11] == '-');
    auVar20[8] = -(buf[0x12] == 'b');
    auVar20[9] = -(buf[0x13] == 'u');
    auVar20[10] = -(buf[0x14] == 'f');
    auVar20[0xb] = -(buf[0x15] == 'f');
    auVar20[0xc] = -(buf[0x16] == 'e');
    auVar20[0xd] = -(buf[0x17] == 'r');
    auVar20[0xe] = -(buf[0x18] == '\n');
    auVar20[0xf] = -(buf[0x19] == '\0');
    auVar19[0] = -(buf[0] == 't');
    auVar19[1] = -(buf[1] == 'e');
    auVar19[2] = -(buf[2] == 's');
    auVar19[3] = -(buf[3] == 't');
    auVar19[4] = -(buf[4] == '-');
    auVar19[5] = -(buf[5] == 'b');
    auVar19[6] = -(buf[6] == 'u');
    auVar19[7] = -(buf[7] == 'f');
    auVar19[8] = -(buf[8] == 'f');
    auVar19[9] = -(buf[9] == 'e');
    auVar19[10] = -(buf[10] == 'r');
    auVar19[0xb] = -(buf[0xb] == '\n');
    auVar19[0xc] = -(buf[0xc] == '\0');
    auVar19[0xd] = -(buf[0xd] == 't');
    auVar19[0xe] = -(buf[0xe] == 'e');
    auVar19[0xf] = -(buf[0xf] == 's');
    auVar19 = auVar19 & auVar20;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001578cf;
    pcStack_3f8 = (code *)0x15783e;
    uv_fs_req_cleanup(&read_req);
    pcStack_3f8 = (code *)0x157854;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001578d4;
    if (close_req.result == 0) {
      pcStack_3f8 = (code *)0x15786e;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  pcStack_3f8 = run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_19();
  pcVar14 = "test_file";
  pcStack_410 = (code *)0x1578f2;
  pcStack_3f8 = (code *)pcVar12;
  unlink("test_file");
  pcStack_410 = (code *)0x1578fe;
  unlink("test_file2");
  pcStack_410 = (code *)0x157903;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  pcStack_410 = (code *)0x157929;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    pcStack_410 = (code *)0x157c1f;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00157c1f:
    pcStack_410 = (code *)0x157c24;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00157c24:
    pcStack_410 = (code *)0x157c29;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00157c29:
    pcStack_410 = (code *)0x157c2e;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00157c2e:
    pcStack_410 = (code *)0x157c33;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00157c33:
    pcStack_410 = (code *)0x157c38;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00157c38:
    pcStack_410 = (code *)0x157c3d;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00157c3d:
    pcStack_410 = (code *)0x157c42;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00157c42:
    pcStack_410 = (code *)0x157c47;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00157c47:
    pcStack_410 = (code *)0x157c4c;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00157c4c:
    pcStack_410 = (code *)0x157c51;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00157c51:
    pcStack_410 = (code *)0x157c56;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00157c56:
    pcStack_410 = (code *)0x157c5b;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00157c5b:
    pcStack_410 = (code *)0x157c60;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00157c60:
    pcStack_410 = (code *)0x157c65;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00157c65:
    pcStack_410 = (code *)0x157c6a;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00157c6a:
    pcStack_410 = (code *)0x157c6f;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00157c6f:
    pcStack_410 = (code *)0x157c74;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00157c74:
    pcStack_410 = (code *)0x157c79;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157c1f;
    pcStack_410 = (code *)0x15794b;
    uv_fs_req_cleanup(&open_req1);
    pcStack_410 = (code *)0x15795c;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_408 = 0;
    iVar4 = 0;
    pcStack_410 = (code *)0x15799a;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157c24;
    if (write_req.result < 0) goto LAB_00157c29;
    pcStack_410 = (code *)0x1579bc;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x1579d2;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c2e;
    if (close_req.result != 0) goto LAB_00157c33;
    pcStack_410 = (code *)0x1579f4;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x157a17;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_00157c38;
    if (open_req1.result._4_4_ < 0) goto LAB_00157c3d;
    pcStack_410 = (code *)0x157a39;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x157a4f;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c42;
    if (close_req.result != 0) goto LAB_00157c47;
    pcStack_410 = (code *)0x157a71;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x157a90;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_00157c4c;
    if (rename_req.result != 0) goto LAB_00157c51;
    pcStack_410 = (code *)0x157ab2;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x157acf;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_00157c56;
    if (open_req1.result._4_4_ < 0) goto LAB_00157c5b;
    pcStack_410 = (code *)0x157af1;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_410 = (code *)0x157b13;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_408 = 0;
    iVar4 = 0;
    pcStack_410 = (code *)0x157b51;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157c60;
    if (read_req.result < 0) goto LAB_00157c65;
    iVar4 = 0x2e3070;
    pcStack_410 = (code *)0x157b7a;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00157c6a;
    pcStack_410 = (code *)0x157b8e;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_410 = (code *)0x157ba4;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c6f;
    if (close_req.result != 0) goto LAB_00157c74;
    pcStack_410 = (code *)0x157bc6;
    uv_fs_req_cleanup(&close_req);
    pcStack_410 = (code *)0x157bd2;
    unlink("test_file");
    pcStack_410 = (code *)0x157bde;
    unlink("test_file2");
    pcStack_410 = (code *)0x157be3;
    pcVar14 = (char *)uv_default_loop();
    pcStack_410 = (code *)0x157bf7;
    uv_walk(pcVar14,close_walk_cb,0);
    pcStack_410 = (code *)0x157c01;
    uv_run(pcVar14,0);
    pcStack_410 = (code *)0x157c06;
    iVar4 = uv_default_loop();
    pcStack_410 = (code *)0x157c0e;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_410 = run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_418 = (uv_fs_t *)0x157c84;
  pcStack_410 = (code *)pcVar14;
  fs_read_bufs(iVar4);
  puStack_418 = (uv_fs_t *)0x157c89;
  fs_read_bufs(iVar4);
  puStack_418 = (uv_fs_t *)0x157c8e;
  __s1 = (undefined1 *)uv_default_loop();
  puStack_418 = (uv_fs_t *)0x157ca2;
  uv_walk(__s1,close_walk_cb,0);
  puStack_418 = (uv_fs_t *)0x157cac;
  uv_run(__s1,0);
  puStack_418 = (uv_fs_t *)0x157cb1;
  uv_default_loop();
  puStack_418 = (uv_fs_t *)0x157cb9;
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
  puStack_418 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_780 = (code *)0x157ced;
  puStack_420 = __s1;
  puStack_418 = __s;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_780 = (code *)0x157f25;
    fs_read_bufs_cold_1();
LAB_00157f25:
    pcStack_780 = (code *)0x157f2a;
    fs_read_bufs_cold_2();
LAB_00157f2a:
    pcStack_780 = (code *)0x157f2f;
    fs_read_bufs_cold_3();
LAB_00157f2f:
    pcStack_780 = (code *)0x157f34;
    fs_read_bufs_cold_4();
LAB_00157f34:
    pcStack_780 = (code *)0x157f39;
    fs_read_bufs_cold_5();
LAB_00157f39:
    pcStack_780 = (code *)0x157f3e;
    fs_read_bufs_cold_6();
LAB_00157f3e:
    pcStack_780 = (code *)0x157f43;
    fs_read_bufs_cold_7();
LAB_00157f43:
    pcStack_780 = (code *)0x157f48;
    fs_read_bufs_cold_8();
LAB_00157f48:
    pcStack_780 = (code *)0x157f4d;
    fs_read_bufs_cold_9();
LAB_00157f4d:
    pcStack_780 = (code *)0x157f52;
    fs_read_bufs_cold_10();
LAB_00157f52:
    pcStack_780 = (code *)0x157f57;
    fs_read_bufs_cold_11();
LAB_00157f57:
    pcStack_780 = (code *)0x157f5c;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157f25;
    pcStack_780 = (code *)0x157d0f;
    uv_fs_req_cleanup();
    uStack_778 = 0;
    iVar4 = 0;
    pcStack_780 = (code *)0x157d33;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157f2a;
    uStack_778 = 0;
    iVar4 = 0;
    pcStack_780 = (code *)0x157d63;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157f2f;
    uStack_778 = 0;
    iVar4 = 0;
    pcStack_780 = (code *)0x157d93;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_768,0,0);
    if (iVar2 != -0x16) goto LAB_00157f34;
    pcStack_780 = (code *)0x157dab;
    auStack_768 = uv_buf_init(auStack_728,0x100);
    __s1 = auStack_768;
    pcStack_780 = (code *)0x157dc9;
    auStack_758 = uv_buf_init(auStack_628,0x100);
    pcStack_780 = (code *)0x157de3;
    auStack_748 = uv_buf_init(auStack_528,0x80);
    pcStack_780 = (code *)0x157dfd;
    auStack_738 = uv_buf_init(auStack_4a8,0x80);
    uStack_778 = 0;
    iVar4 = 0;
    pcStack_780 = (code *)0x157e2d;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar2 != 0x1be) goto LAB_00157f39;
    if (read_req.result != 0x1be) goto LAB_00157f3e;
    __s1 = auStack_748;
    __s = &read_req;
    pcStack_780 = (code *)0x157e5d;
    uv_fs_req_cleanup();
    uStack_778 = 0;
    iVar4 = 0;
    pcStack_780 = (code *)0x157e84;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157f43;
    if (read_req.result != 0xbe) goto LAB_00157f48;
    pcStack_780 = (code *)0x157eac;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_758._0_8_;
    pcStack_780 = (code *)0x157ec3;
    puVar15 = (undefined1 *)auStack_758._0_8_;
    iVar2 = bcmp((void *)auStack_758._0_8_,(void *)auStack_748._0_8_,0x80);
    iVar4 = (int)puVar15;
    if (iVar2 != 0) goto LAB_00157f4d;
    __s1 = __s1 + 0x80;
    pcStack_780 = (code *)0x157ee1;
    puVar15 = __s1;
    iVar2 = bcmp(__s1,(void *)auStack_738._0_8_,0x3e);
    iVar4 = (int)puVar15;
    if (iVar2 != 0) goto LAB_00157f52;
    iVar4 = 0;
    pcStack_780 = (code *)0x157efb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157f57;
    if (close_req.result == 0) {
      pcStack_780 = (code *)0x157f15;
      iVar2 = uv_fs_req_cleanup(&close_req);
      return iVar2;
    }
  }
  pcStack_780 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_788 = (code *)0x157f67;
  pcStack_780 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_788 = (code *)0x157f6c;
  fs_read_file_eof(iVar4);
  pcStack_788 = (code *)0x157f71;
  uVar7 = uv_default_loop();
  pcStack_788 = (code *)0x157f85;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_788 = (code *)0x157f8f;
  uv_run(uVar7,0);
  pcStack_788 = (code *)0x157f94;
  uVar8 = uv_default_loop();
  pcStack_788 = (code *)0x157f9c;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_788 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar13 = (uv_fs_t *)0x184385;
  puStack_7a0 = (uv_fs_t *)0x157fbd;
  pcStack_788 = (code *)uVar7;
  unlink("test_file");
  puStack_7a0 = (uv_fs_t *)0x157fc2;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_7a0 = (uv_fs_t *)0x157fe8;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_7a0 = (uv_fs_t *)0x158245;
    fs_read_file_eof_cold_1();
LAB_00158245:
    puStack_7a0 = (uv_fs_t *)0x15824a;
    fs_read_file_eof_cold_2();
LAB_0015824a:
    puStack_7a0 = (uv_fs_t *)0x15824f;
    fs_read_file_eof_cold_3();
LAB_0015824f:
    puStack_7a0 = (uv_fs_t *)0x158254;
    fs_read_file_eof_cold_4();
LAB_00158254:
    puStack_7a0 = (uv_fs_t *)0x158259;
    fs_read_file_eof_cold_5();
LAB_00158259:
    puStack_7a0 = (uv_fs_t *)0x15825e;
    fs_read_file_eof_cold_6();
LAB_0015825e:
    puStack_7a0 = (uv_fs_t *)0x158263;
    fs_read_file_eof_cold_7();
LAB_00158263:
    puStack_7a0 = (uv_fs_t *)0x158268;
    fs_read_file_eof_cold_8();
LAB_00158268:
    puStack_7a0 = (uv_fs_t *)0x15826d;
    fs_read_file_eof_cold_9();
LAB_0015826d:
    puStack_7a0 = (uv_fs_t *)0x158272;
    fs_read_file_eof_cold_10();
LAB_00158272:
    puStack_7a0 = (uv_fs_t *)0x158277;
    fs_read_file_eof_cold_11();
LAB_00158277:
    puStack_7a0 = (uv_fs_t *)0x15827c;
    fs_read_file_eof_cold_12();
LAB_0015827c:
    puStack_7a0 = (uv_fs_t *)0x158281;
    fs_read_file_eof_cold_13();
LAB_00158281:
    puStack_7a0 = (uv_fs_t *)0x158286;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158245;
    puStack_7a0 = (uv_fs_t *)0x15800a;
    uv_fs_req_cleanup(&open_req1);
    puStack_7a0 = (uv_fs_t *)0x15801b;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_798 = 0;
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x158059;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015824a;
    if (write_req.result < 0) goto LAB_0015824f;
    puStack_7a0 = (uv_fs_t *)0x15807b;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x158091;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158254;
    if (close_req.result != 0) goto LAB_00158259;
    puStack_7a0 = (uv_fs_t *)0x1580b3;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x1580d0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_0015825e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158263;
    puStack_7a0 = (uv_fs_t *)0x1580f2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_7a0 = (uv_fs_t *)0x158114;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_798 = 0;
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x158152;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158268;
    if (read_req.result < 0) goto LAB_0015826d;
    iVar4 = 0x2e3070;
    puStack_7a0 = (uv_fs_t *)0x15817b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158272;
    puVar13 = &read_req;
    puStack_7a0 = (uv_fs_t *)0x158192;
    uv_fs_req_cleanup(&read_req);
    puStack_7a0 = (uv_fs_t *)0x1581a3;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_798 = 0;
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x1581dd;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_00158277;
    if (read_req.result != 0) goto LAB_0015827c;
    puStack_7a0 = (uv_fs_t *)0x1581ff;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_7a0 = (uv_fs_t *)0x158215;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158281;
    if (close_req.result == 0) {
      puStack_7a0 = (uv_fs_t *)0x15822f;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_7a0 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_7a8 = (uv_fs_t *)0x158291;
  puStack_7a0 = puVar13;
  fs_write_multiple_bufs(iVar4);
  puStack_7a8 = (uv_fs_t *)0x158296;
  fs_write_multiple_bufs(iVar4);
  puStack_7a8 = (uv_fs_t *)0x15829b;
  uVar7 = uv_default_loop();
  puStack_7a8 = (uv_fs_t *)0x1582af;
  uv_walk(uVar7,close_walk_cb,0);
  puStack_7a8 = (uv_fs_t *)0x1582b9;
  uv_run(uVar7,0);
  puStack_7a8 = (uv_fs_t *)0x1582be;
  uVar8 = uv_default_loop();
  puStack_7a8 = (uv_fs_t *)0x1582c6;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_7a8 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_7b0 = uVar7;
  puStack_7a8 = __s;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00158766:
    fs_write_multiple_bufs_cold_2();
LAB_0015876b:
    fs_write_multiple_bufs_cold_3();
LAB_00158770:
    fs_write_multiple_bufs_cold_4();
LAB_00158775:
    fs_write_multiple_bufs_cold_5();
LAB_0015877a:
    fs_write_multiple_bufs_cold_6();
LAB_0015877f:
    fs_write_multiple_bufs_cold_7();
LAB_00158784:
    fs_write_multiple_bufs_cold_8();
LAB_00158789:
    fs_write_multiple_bufs_cold_9();
LAB_0015878e:
    fs_write_multiple_bufs_cold_10();
LAB_00158793:
    fs_write_multiple_bufs_cold_11();
LAB_00158798:
    fs_write_multiple_bufs_cold_12();
LAB_0015879d:
    fs_write_multiple_bufs_cold_13();
LAB_001587a2:
    fs_write_multiple_bufs_cold_14();
LAB_001587a7:
    fs_write_multiple_bufs_cold_15();
LAB_001587ac:
    fs_write_multiple_bufs_cold_16();
LAB_001587b1:
    fs_write_multiple_bufs_cold_19();
LAB_001587b6:
    fs_write_multiple_bufs_cold_20();
LAB_001587bb:
    fs_write_multiple_bufs_cold_21();
LAB_001587c0:
    fs_write_multiple_bufs_cold_22();
LAB_001587c5:
    fs_write_multiple_bufs_cold_23();
LAB_001587ca:
    fs_write_multiple_bufs_cold_24();
LAB_001587cf:
    fs_write_multiple_bufs_cold_25();
LAB_001587d4:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158766;
    uv_fs_req_cleanup(&open_req1);
    auStack_7d8 = uv_buf_init(test_buf,0xd);
    auStack_7c8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_7d8,2,0);
    if (iVar4 < 0) goto LAB_0015876b;
    if (write_req.result < 0) goto LAB_00158770;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158775;
    if (close_req.result != 0) goto LAB_0015877a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_0015877f;
    if (open_req1.result._4_4_ < 0) goto LAB_00158784;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar19 = uv_buf_init(buf,0xd);
    auStack_7d8 = auVar19;
    auVar19 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_7c8 = auVar19;
    _Var9 = lseek64((int)open_req1.result,0,1);
    if (_Var9 != 0) goto LAB_00158789;
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_7d8,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_0015878e;
    if (read_req.result != 0x1c) goto LAB_00158793;
    iVar2 = 0x2e3070;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00158798;
    iVar2 = 0x2e4460;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_0015879d;
    uv_fs_req_cleanup(&read_req);
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_001587a2;
    if (read_req.result != 0) goto LAB_001587a7;
    uv_fs_req_cleanup(&read_req);
    auVar19 = uv_buf_init(buf,0xd);
    auStack_7d8 = auVar19;
    auVar19 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_7c8 = auVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_7d8,2,0);
    if (iVar4 < 0) goto LAB_001587ac;
    if (read_req.result == 0x1c) {
LAB_00158664:
      iVar2 = 0x2e3070;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_001587b1;
      iVar2 = 0x2e4460;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_001587b6;
      uv_fs_req_cleanup(&read_req);
      uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar21;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_001587bb;
      if (read_req.result != 0) goto LAB_001587c0;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_001587c5;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_001587ca;
    }
    if (read_req.result != 0xd) goto LAB_001587cf;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_7c8,1,read_req.result);
    if (iVar4 < 0) goto LAB_001587d4;
    if (read_req.result == 0xf) goto LAB_00158664;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar7 = uv_default_loop();
  uv_walk(uVar7,close_walk_cb,0);
  uv_run(uVar7,0);
  uVar7 = uv_default_loop();
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar10 = malloc(0xd4310);
  if (pvVar10 == (void *)0x0) {
LAB_00158b56:
    fs_write_alotof_bufs_cold_18();
LAB_00158b5b:
    fs_write_alotof_bufs_cold_1();
LAB_00158b60:
    fs_write_alotof_bufs_cold_2();
LAB_00158b65:
    fs_write_alotof_bufs_cold_3();
LAB_00158b6a:
    fs_write_alotof_bufs_cold_4();
LAB_00158b6f:
    fs_write_alotof_bufs_cold_17();
LAB_00158b74:
    fs_write_alotof_bufs_cold_5();
LAB_00158b79:
    fs_write_alotof_bufs_cold_6();
LAB_00158b7e:
    fs_write_alotof_bufs_cold_7();
LAB_00158b83:
    fs_write_alotof_bufs_cold_8();
LAB_00158b88:
    fs_write_alotof_bufs_cold_9();
LAB_00158b8d:
    fs_write_alotof_bufs_cold_10();
LAB_00158b92:
    fs_write_alotof_bufs_cold_12();
LAB_00158b97:
    fs_write_alotof_bufs_cold_13();
LAB_00158b9c:
    fs_write_alotof_bufs_cold_14();
LAB_00158ba1:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00158b5b;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b60;
    uv_fs_req_cleanup(&open_req1);
    lVar17 = 8;
    do {
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158b65;
    if (write_req.result != 0xac67d) goto LAB_00158b6a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar11 = malloc(0xac67d);
    if (pvVar11 == (void *)0x0) goto LAB_00158b6f;
    lVar17 = 8;
    pvVar18 = pvVar11;
    do {
      auVar19 = uv_buf_init(pvVar18,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pvVar18 = (void *)((long)pvVar18 + 0xd);
    } while (lVar17 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00158b74;
    if (close_req.result != 0) goto LAB_00158b79;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158b7e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b83;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158b88;
    if (read_req.result != 0x3400) goto LAB_00158b8d;
    unaff_R12 = 0;
    do {
      pcVar12 = (char *)((long)pvVar11 + unaff_R12);
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158b56;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar11);
    iVar2 = (int)open_req1.result;
    _Var9 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var9 != write_req.result) goto LAB_00158b92;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158b97;
    if (read_req.result != 0) goto LAB_00158b9c;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158ba1;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar10);
      return extraout_EAX_00;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar10 = (void *)uv_default_loop();
  uv_walk(pvVar10,close_walk_cb,0);
  uv_run(pvVar10,0);
  uVar7 = uv_default_loop();
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_870 = (code *)0x158c0d;
  pvStack_850 = pvVar10;
  lStack_848 = unaff_R12;
  unlink("test_file");
  pcStack_870 = (code *)0x158c12;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_870 = (code *)0x158c23;
  pvVar11 = malloc(0xd4310);
  if (pvVar11 == (void *)0x0) {
LAB_00158f6f:
    pvVar11 = pvVar10;
    pcStack_870 = (code *)0x158f74;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158f74:
    pcStack_870 = (code *)0x158f79;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158f79:
    pcStack_870 = (code *)0x158f7e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158f7e:
    pcStack_870 = (code *)0x158f83;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158f83:
    pcStack_870 = (code *)0x158f88;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158f88:
    pcStack_870 = (code *)0x158f8d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158f8d:
    pcStack_870 = (code *)0x158f92;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158f92:
    pcStack_870 = (code *)0x158f97;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158f97:
    pcStack_870 = (code *)0x158f9c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158f9c:
    pcStack_870 = (code *)0x158fa1;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158fa1:
    pcStack_870 = (code *)0x158fa6;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158fa6:
    pcStack_870 = (code *)0x158fab;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158fab:
    pcStack_870 = (code *)0x158fb0;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158fb0:
    pcStack_870 = (code *)0x158fb5;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158fb5:
    pcStack_870 = (code *)0x158fba;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_870 = (code *)0x158c52;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158f74;
    if (open_req1.result._4_4_ < 0) goto LAB_00158f79;
    pcStack_870 = (code *)0x158c74;
    uv_fs_req_cleanup(&open_req1);
    pcStack_870 = (code *)0x158c85;
    uVar21 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_868 = 0;
    pcStack_870 = (code *)0x158cc3;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158f7e;
    if (write_req.result != 10) goto LAB_00158f83;
    pcStack_870 = (code *)0x158ce8;
    uv_fs_req_cleanup(&write_req);
    lVar17 = 8;
    do {
      pcStack_870 = (code *)0x158d02;
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    uStack_868 = 0;
    pcStack_870 = (code *)0x158d43;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f88;
    if (write_req.result != 0xac67d) goto LAB_00158f8d;
    pcStack_870 = (code *)0x158d68;
    uv_fs_req_cleanup(&write_req);
    pcStack_870 = (code *)0x158d72;
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00158f92;
    lVar17 = 8;
    pcVar14 = pcVar12;
    do {
      pcStack_870 = (code *)0x158d94;
      auVar19 = uv_buf_init(pcVar14,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pcVar14 = pcVar14 + 0xd;
    } while (lVar17 != 0xd4318);
    uStack_868 = 0;
    pcStack_870 = (code *)0x158dd6;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f97;
    lStack_858 = 10;
    lVar17 = 0xd;
    if (iVar2 != 0xd) {
      lVar17 = 0x3400;
    }
    if (read_req.result != lVar17) goto LAB_00158f9c;
    pcVar14 = pcVar12;
    uVar16 = 0;
    do {
      pcStack_870 = (code *)0x158e20;
      iVar4 = strncmp(pcVar14,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_870 = (code *)0x158f6f;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar10 = pvVar11;
        goto LAB_00158f6f;
      }
      if (iVar2 == 0xd) break;
      pcVar14 = pcVar14 + 0xd;
      bVar1 = uVar16 < 0x3ff;
      uVar16 = uVar16 + 1;
    } while (bVar1);
    pcStack_870 = (code *)0x158e4d;
    uv_fs_req_cleanup(&read_req);
    pcStack_870 = (code *)0x158e55;
    free(pcVar12);
    pcStack_870 = (code *)0x158e6c;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar17 = lStack_858;
    if (iVar2 != 0) goto LAB_00158fa1;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_858) goto LAB_00158fa6;
    pcStack_870 = (code *)0x158ea0;
    uv_fs_req_cleanup(&stat_req);
    pcStack_870 = (code *)0x158eb1;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_868 = 0;
    pcStack_870 = (code *)0x158ef2;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar17 + write_req.result);
    if (iVar2 != 0) goto LAB_00158fab;
    if (read_req.result != 0) goto LAB_00158fb0;
    pcStack_870 = (code *)0x158f14;
    uv_fs_req_cleanup(&read_req);
    pcStack_870 = (code *)0x158f2a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158fb5;
    if (close_req.result == 0) {
      pcStack_870 = (code *)0x158f48;
      uv_fs_req_cleanup(&close_req);
      pcStack_870 = (code *)0x158f54;
      unlink("test_file");
      free(pvVar11);
      return extraout_EAX_01;
    }
  }
  pcStack_870 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_870 = (code *)pvVar11;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00159131;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159136;
    uv_fs_req_cleanup(&open_req1);
    uVar21 = (uv_buf_t)uv_buf_init(auStack_872,2);
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_0015913b;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar2 = uv_loop_close(uVar7);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00159145;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00159131:
    run_test_fs_read_dir_cold_2();
LAB_00159136:
    run_test_fs_read_dir_cold_3();
LAB_0015913b:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159145:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_non_existent_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./non_existent_dir/";
  loop = uv_default_loop();

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_ENOENT == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, non_existent_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}